

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O0

CURLcode Curl_ntlm_core_mk_ntlmv2_resp
                   (uchar *ntlmv2hash,uchar *challenge_client,ntlmdata *ntlm,uchar **ntresp,
                   uint *ntresp_len)

{
  uint uVar1;
  time_t tVar2;
  CURLcode result;
  curl_off_t tw;
  uchar hmac_output [16];
  uchar *ptr;
  uint len;
  uint *ntresp_len_local;
  uchar **ntresp_local;
  ntlmdata *ntlm_local;
  uchar *challenge_client_local;
  uchar *ntlmv2hash_local;
  
  hmac_output[8] = '\0';
  hmac_output[9] = '\0';
  hmac_output[10] = '\0';
  hmac_output[0xb] = '\0';
  hmac_output[0xc] = '\0';
  hmac_output[0xd] = '\0';
  hmac_output[0xe] = '\0';
  hmac_output[0xf] = '\0';
  tVar2 = time((time_t *)0x0);
  uVar1 = ntlm->target_info_len + 0x30;
  hmac_output._8_8_ = (*Curl_ccalloc)(1,(size_t)uVar1);
  if ((void *)hmac_output._8_8_ == (void *)0x0) {
    ntlmv2hash_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    curl_msnprintf((char *)(hmac_output._8_8_ + 0x10),(ulong)(ntlm->target_info_len + 0x20),
                   "%c%c%c%c%c%c%c%c",1,1,0,0,0,0,0,0);
    Curl_write64_le((tVar2 + 0x2b6109100) * 10000000,(uchar *)(hmac_output._8_8_ + 0x18));
    *(undefined8 *)(hmac_output._8_8_ + 0x20) = *(undefined8 *)challenge_client;
    memcpy((void *)(hmac_output._8_8_ + 0x2c),ntlm->target_info,(ulong)ntlm->target_info_len);
    *(undefined8 *)(hmac_output._8_8_ + 8) = *(undefined8 *)ntlm->nonce;
    ntlmv2hash_local._4_4_ =
         hmac_md5(ntlmv2hash,0x10,(uchar *)(hmac_output._8_8_ + 8),ntlm->target_info_len + 0x28,
                  (uchar *)&tw);
    if (ntlmv2hash_local._4_4_ == CURLE_OK) {
      *(curl_off_t *)hmac_output._8_8_ = tw;
      *(undefined8 *)(hmac_output._8_8_ + 8) = hmac_output._0_8_;
      *ntresp = (uchar *)hmac_output._8_8_;
      *ntresp_len = uVar1;
    }
    else {
      (*Curl_cfree)((void *)hmac_output._8_8_);
    }
  }
  return ntlmv2hash_local._4_4_;
}

Assistant:

CURLcode Curl_ntlm_core_mk_ntlmv2_resp(unsigned char *ntlmv2hash,
                                       unsigned char *challenge_client,
                                       struct ntlmdata *ntlm,
                                       unsigned char **ntresp,
                                       unsigned int *ntresp_len)
{
/* NTLMv2 response structure :
------------------------------------------------------------------------------
0     HMAC MD5         16 bytes
------BLOB--------------------------------------------------------------------
16    Signature        0x01010000
20    Reserved         long (0x00000000)
24    Timestamp        LE, 64-bit signed value representing the number of
                       tenths of a microsecond since January 1, 1601.
32    Client Nonce     8 bytes
40    Unknown          4 bytes
44    Target Info      N bytes (from the type-2 message)
44+N  Unknown          4 bytes
------------------------------------------------------------------------------
*/

  unsigned int len = 0;
  unsigned char *ptr = NULL;
  unsigned char hmac_output[NTLM_HMAC_MD5_LEN];
  curl_off_t tw;

  CURLcode result = CURLE_OK;

#if CURL_SIZEOF_CURL_OFF_T < 8
#error "this section needs 64bit support to work"
#endif

  /* Calculate the timestamp */
#ifdef DEBUGBUILD
  char *force_timestamp = getenv("CURL_FORCETIME");
  if(force_timestamp)
    tw = CURL_OFF_T_C(11644473600) * 10000000;
  else
#endif
    tw = ((curl_off_t)time(NULL) + CURL_OFF_T_C(11644473600)) * 10000000;

  /* Calculate the response len */
  len = NTLM_HMAC_MD5_LEN + NTLMv2_BLOB_LEN;

  /* Allocate the response */
  ptr = calloc(1, len);
  if(!ptr)
    return CURLE_OUT_OF_MEMORY;

  /* Create the BLOB structure */
  msnprintf((char *)ptr + NTLM_HMAC_MD5_LEN, NTLMv2_BLOB_LEN,
            "%c%c%c%c"   /* NTLMv2_BLOB_SIGNATURE */
            "%c%c%c%c",  /* Reserved = 0 */
            NTLMv2_BLOB_SIGNATURE[0], NTLMv2_BLOB_SIGNATURE[1],
            NTLMv2_BLOB_SIGNATURE[2], NTLMv2_BLOB_SIGNATURE[3],
            0, 0, 0, 0);

  Curl_write64_le(tw, ptr + 24);
  memcpy(ptr + 32, challenge_client, 8);
  memcpy(ptr + 44, ntlm->target_info, ntlm->target_info_len);

  /* Concatenate the Type 2 challenge with the BLOB and do HMAC MD5 */
  memcpy(ptr + 8, &ntlm->nonce[0], 8);
  result = hmac_md5(ntlmv2hash, NTLM_HMAC_MD5_LEN, ptr + 8,
                    NTLMv2_BLOB_LEN + 8, hmac_output);
  if(result) {
    free(ptr);
    return result;
  }

  /* Concatenate the HMAC MD5 output  with the BLOB */
  memcpy(ptr, hmac_output, NTLM_HMAC_MD5_LEN);

  /* Return the response */
  *ntresp = ptr;
  *ntresp_len = len;

  return result;
}